

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void JX9_TIME_Const(jx9_value *pVal,void *pUnused)

{
  time_t local_60;
  time_t t;
  tm *pTm;
  Sytm sTm;
  void *pUnused_local;
  jx9_value *pVal_local;
  
  sTm.tm_gmtoff = (long)pUnused;
  time(&local_60);
  t = (time_t)gmtime(&local_60);
  sTm.tm_sec = ((tm *)t)->tm_hour;
  pTm._4_4_ = ((tm *)t)->tm_min;
  pTm._0_4_ = ((tm *)t)->tm_sec;
  sTm.tm_hour = ((tm *)t)->tm_mon;
  sTm.tm_min = ((tm *)t)->tm_mday;
  sTm.tm_mday = ((tm *)t)->tm_year + 0x76c;
  sTm.tm_year = ((tm *)t)->tm_yday;
  sTm.tm_mon = ((tm *)t)->tm_wday;
  sTm.tm_wday = ((tm *)t)->tm_isdst;
  sTm.tm_zone = (char *)0x0;
  sTm.tm_isdst = 0;
  sTm._36_4_ = 0;
  sTm.tm_gmtoff = 0;
  jx9_value_string_format
            (pVal,"%02d:%02d:%02d",(ulong)(uint)sTm.tm_sec,(ulong)pTm._4_4_,(ulong)(uint)pTm);
  return;
}

Assistant:

static void JX9_TIME_Const(jx9_value *pVal, void *pUnused)
{
	Sytm sTm;
#ifdef __WINNT__
	SYSTEMTIME sOS;
	GetSystemTime(&sOS);
	SYSTEMTIME_TO_SYTM(&sOS, &sTm);
#else
	struct tm *pTm;
	time_t t;
	time(&t);
	pTm = gmtime(&t);
	STRUCT_TM_TO_SYTM(pTm, &sTm);
#endif
	SXUNUSED(pUnused); /* cc warning */
	/* Expand */
	jx9_value_string_format(pVal, "%02d:%02d:%02d", sTm.tm_hour, sTm.tm_min, sTm.tm_sec);
}